

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decUtil.c
# Opt level: O1

DdNode * Dec_GraphDeriveBdd(DdManager *dd,Dec_Graph_t *pGraph)

{
  uint uVar1;
  Dec_Node_t *pDVar2;
  int iVar3;
  DdNode *pDVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  undefined1 *puVar8;
  long lVar9;
  
  uVar1 = pGraph->nLeaves;
  if ((int)uVar1 < 0) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/dec/decUtil.c"
                  ,0x39,"DdNode *Dec_GraphDeriveBdd(DdManager *, Dec_Graph_t *)");
  }
  if ((int)uVar1 <= pGraph->nSize) {
    if (pGraph->fConst == 0) {
      uVar5 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
      if (uVar5 < uVar1) {
        pDVar4 = Cudd_bddIthVar(dd,uVar5);
      }
      else {
        iVar3 = pGraph->nLeaves;
        if (iVar3 < 1) {
          puVar8 = (undefined1 *)0x0;
        }
        else {
          lVar9 = 0;
          lVar7 = -0x18;
          do {
            lVar6 = lVar7;
            pDVar2 = pGraph->pNodes;
            pDVar4 = Cudd_bddIthVar(dd,(int)lVar9);
            *(DdNode **)((long)&pDVar2[1].field_2 + lVar6) = pDVar4;
            lVar9 = lVar9 + 1;
            iVar3 = pGraph->nLeaves;
            lVar7 = lVar6 + 0x18;
          } while (lVar9 < iVar3);
          puVar8 = &pDVar2[1].eEdge0.field_0x0 + lVar6;
        }
        if (iVar3 < pGraph->nSize) {
          lVar9 = (long)iVar3;
          lVar7 = lVar9 * 0x18 + -0x18;
          do {
            lVar6 = lVar7;
            pDVar2 = pGraph->pNodes;
            uVar1 = *(uint *)(&pDVar2[1].eEdge0.field_0x0 + lVar6);
            uVar5 = *(uint *)(&pDVar2[1].eEdge1.field_0x0 + lVar6);
            pDVar4 = Cudd_bddAnd(dd,(DdNode *)
                                    ((ulong)(uVar1 & 1) ^
                                    (ulong)pDVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc),
                                 (DdNode *)
                                 ((ulong)(uVar5 & 1) ^
                                 (ulong)pDVar2[uVar5 >> 1 & 0x3fffffff].field_2.pFunc));
            *(DdNode **)((long)&pDVar2[1].field_2 + lVar6) = pDVar4;
            Cudd_Ref(pDVar4);
            lVar9 = lVar9 + 1;
            lVar7 = lVar6 + 0x18;
          } while (lVar9 < pGraph->nSize);
          puVar8 = &pDVar2[1].eEdge0.field_0x0 + lVar6;
        }
        pDVar4 = *(DdNode **)(puVar8 + 8);
        Cudd_Ref(pDVar4);
        lVar7 = (long)pGraph->nLeaves;
        if (pGraph->nLeaves < pGraph->nSize) {
          lVar9 = lVar7 * 0x18 + 8;
          do {
            Cudd_RecursiveDeref(dd,*(DdNode **)(&(pGraph->pNodes->eEdge0).field_0x0 + lVar9));
            lVar7 = lVar7 + 1;
            lVar9 = lVar9 + 0x18;
          } while (lVar7 < pGraph->nSize);
        }
        Cudd_Deref(pDVar4);
      }
    }
    else {
      pDVar4 = dd->one;
    }
    return (DdNode *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pDVar4);
  }
  __assert_fail("Dec_GraphLeaveNum(pGraph) <= pGraph->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/dec/decUtil.c"
                ,0x3a,"DdNode *Dec_GraphDeriveBdd(DdManager *, Dec_Graph_t *)");
}

Assistant:

DdNode * Dec_GraphDeriveBdd( DdManager * dd, Dec_Graph_t * pGraph )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;

    // sanity checks
    assert( Dec_GraphLeaveNum(pGraph) >= 0 );
    assert( Dec_GraphLeaveNum(pGraph) <= pGraph->nSize );

    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Cudd_NotCond( b1, Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Cudd_NotCond( Cudd_bddIthVar(dd, Dec_GraphVarInt(pGraph)), Dec_GraphIsComplement(pGraph) );

    // assign the elementary variables
    Dec_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Cudd_bddIthVar( dd, i );

    // compute the function for each internal node
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        bFunc1 = Cudd_NotCond( Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( (DdNode *)pNode->pFunc );
    }

    // deref the intermediate results
    bFunc = (DdNode *)pNode->pFunc;   Cudd_Ref( bFunc );
    Dec_GraphForEachNode( pGraph, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pFunc );
    Cudd_Deref( bFunc );

    // complement the result if necessary
    return Cudd_NotCond( bFunc, Dec_GraphIsComplement(pGraph) );
}